

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void add_to_temp_string(c2m_ctx_t c2m_ctx,char *str)

{
  c2m_ctx_t pcVar1;
  char cVar2;
  short sVar3;
  VARR_char *pVVar4;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  c2m_ctx_t in_RAX;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  undefined4 *puVar12;
  c2m_ctx_t pcVar13;
  size_t sVar14;
  char *pcVar15;
  node_t pnVar16;
  ulong *extraout_RDX;
  c2m_ctx_t pcVar17;
  c2m_ctx_t unaff_RBX;
  VARR_char *unaff_RBP;
  c2mir_options *pcVar18;
  c2m_ctx_t tree;
  node_t_conflict pnVar19;
  c2m_ctx_t c2m_ctx_00;
  short *unaff_R12;
  c2m_ctx_t pcVar20;
  size_t unaff_R13;
  c2m_ctx_t pcVar21;
  VARR_char *unaff_R14;
  size_t unaff_R15;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  val vVar25;
  pos_t pVar26;
  val vStack_140;
  val vStack_130;
  char *pcStack_120;
  short *psStack_118;
  c2m_ctx_t pcStack_110;
  c2m_ctx_t pcStack_108;
  c2m_ctx_t pcStack_100;
  c2m_ctx_t pcStack_f0;
  c2m_ctx_t pcStack_e8;
  pre_ctx *ppStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  macro_t pmStack_c8;
  macro mStack_c0;
  c2m_ctx_t pcStack_a0;
  short *psStack_98;
  size_t sStack_90;
  VARR_char *pVStack_88;
  size_t sStack_80;
  VARR_char *pVStack_78;
  c2m_ctx_t pcStack_68;
  short *psStack_60;
  size_t sStack_58;
  VARR_char *pVStack_50;
  size_t sStack_48;
  VARR_char *pVStack_40;
  c2m_ctx_t local_38;
  
  pVVar4 = c2m_ctx->temp_string;
  tree = (c2m_ctx_t)str;
  c2m_ctx_00 = c2m_ctx;
  sVar9 = unaff_R15;
  local_38 = in_RAX;
  if (pVVar4 == (VARR_char *)0x0) {
LAB_00194f2e:
    pVStack_40 = (VARR_char *)0x194f33;
    add_to_temp_string_cold_4();
LAB_00194f33:
    pVStack_40 = (VARR_char *)0x194f38;
    add_to_temp_string_cold_3();
  }
  else {
    unaff_R12 = (short *)str;
    if (pVVar4->els_num == 0) {
LAB_00194e58:
      pVStack_40 = (VARR_char *)0x194e60;
      sVar9 = strlen(str);
      if (sVar9 != 0) {
        unaff_R13 = 0;
        local_38 = c2m_ctx;
        do {
          unaff_RBP = c2m_ctx->temp_string;
          c2m_ctx_00 = (c2m_ctx_t)unaff_RBP->varr;
          if (c2m_ctx_00 == (c2m_ctx_t)0x0) {
            pVStack_40 = (VARR_char *)0x194f2e;
            add_to_temp_string_cold_2();
            unaff_RBX = c2m_ctx;
            goto LAB_00194f2e;
          }
          cVar2 = str[unaff_R13];
          unaff_R14 = (VARR_char *)CONCAT71((int7)((ulong)unaff_R14 >> 8),cVar2);
          uVar10 = unaff_RBP->els_num + 1;
          if (unaff_RBP->size < uVar10) {
            pcVar20 = (c2m_ctx_t)((uVar10 >> 1) + uVar10);
            pVStack_40 = (VARR_char *)0x194ea8;
            tree = pcVar20;
            pcVar11 = (char *)realloc(c2m_ctx_00,(size_t)pcVar20);
            unaff_RBP->varr = pcVar11;
            unaff_RBP->size = (size_t)pcVar20;
            c2m_ctx = local_38;
          }
          sVar14 = unaff_RBP->els_num;
          unaff_RBP->els_num = sVar14 + 1;
          unaff_RBP->varr[sVar14] = cVar2;
          unaff_R13 = unaff_R13 + 1;
          unaff_R15 = sVar9;
        } while (sVar9 != unaff_R13);
      }
      unaff_R14 = c2m_ctx->temp_string;
      c2m_ctx_00 = (c2m_ctx_t)unaff_R14->varr;
      unaff_RBX = c2m_ctx;
      sVar9 = unaff_R15;
      if (c2m_ctx_00 != (c2m_ctx_t)0x0) {
        uVar10 = unaff_R14->els_num + 1;
        if (unaff_R14->size < uVar10) {
          sVar9 = (uVar10 >> 1) + uVar10;
          pVStack_40 = (VARR_char *)0x194f00;
          pcVar11 = (char *)realloc(c2m_ctx_00,sVar9);
          unaff_R14->varr = pcVar11;
          unaff_R14->size = sVar9;
        }
        sVar14 = unaff_R14->els_num;
        unaff_R14->els_num = sVar14 + 1;
        unaff_R14->varr[sVar14] = '\0';
        return;
      }
      goto LAB_00194f33;
    }
    unaff_RBX = c2m_ctx;
    if (pVVar4->varr != (char *)0x0) {
      sVar14 = pVVar4->els_num - 1;
      if (pVVar4->varr[sVar14] == '\0') {
        pVVar4->els_num = sVar14;
      }
      goto LAB_00194e58;
    }
  }
  pVStack_40 = (VARR_char *)check_pragma;
  add_to_temp_string_cold_1();
  pcStack_68 = unaff_RBX;
  psStack_60 = unaff_R12;
  sStack_58 = unaff_R13;
  pVStack_50 = unaff_R14;
  sStack_48 = sVar9;
  pVStack_40 = unaff_RBP;
  if (extraout_RDX == (ulong *)0x0) {
    pVStack_78 = (VARR_char *)replace_defined;
    check_pragma_cold_1();
    pcStack_e8 = c2m_ctx_00;
    pcStack_a0 = unaff_RBX;
    psStack_98 = unaff_R12;
    sStack_90 = unaff_R13;
    pVStack_88 = unaff_R14;
    sStack_80 = sVar9;
    pVStack_78 = unaff_RBP;
    if (tree != (c2m_ctx_t)0x0) {
      ppStack_e0 = c2m_ctx_00->pre_ctx;
      pcVar20 = (c2m_ctx_t)&DAT_00000001;
      iVar6 = 0;
      pcStack_f0 = tree;
      do {
        pcVar1 = (c2m_ctx_t)((long)&pcVar20[-1].gen_ctx + 7);
        pcVar21 = (c2m_ctx_t)tree->ctx;
        if (pcVar21 <= pcVar1) {
          return;
        }
        pnVar16 = (node_t)tree->env[0].__jmpbuf[0];
        if (pnVar16 == (node_t)0x0) {
          pcStack_100 = (c2m_ctx_t)0x1953ec;
          replace_defined_cold_3();
          pcVar11 = (char *)0x0;
LAB_001953ec:
          pcStack_100 = (c2m_ctx_t)0x1953f1;
          replace_defined_cold_2();
          pcVar13 = c2m_ctx_00;
          c2m_ctx_00 = pcVar21;
LAB_001953f1:
          pcStack_100 = (c2m_ctx_t)eval;
          replace_defined_cold_1();
          pcStack_120 = pcVar11;
          psStack_118 = unaff_R12;
          pcStack_110 = c2m_ctx_00;
          pcStack_108 = pcVar1;
          pcStack_100 = pcVar20;
          switch(*(node_code_t *)&tree->ctx) {
          case N_IGNORE:
            pVar26 = get_node_pos(pcVar13,(node_t_conflict)tree);
            error(pcVar13,0x1c3235,pVar26.fname,pVar26._8_8_);
            return;
          case N_I:
          case N_L:
          case N_LL:
            return;
          case N_U:
          case N_UL:
          case N_ULL:
          case N_CH16:
          case N_CH32:
            return;
          default:
            __assert_fail("FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0xddc,"struct val eval(c2m_ctx_t, node_t)");
          case N_CH:
            return;
          case N_ANDAND:
          case N_OROR:
            vVar25 = eval(pcVar13,(node_t_conflict)tree->env[0].__jmpbuf[2]);
            vStack_140.u = vVar25.u;
            vStack_140.uns_p = vVar25.uns_p;
            if (*(node_code_t *)&tree->ctx == N_ANDAND) {
              if (vStack_140.u.i_val == 0) {
                return;
              }
            }
            else if (vStack_140.u.i_val != 0) {
              return;
            }
            pnVar19 = (node_t_conflict)tree->env[0].__jmpbuf[2];
            if (pnVar19 != (node_t_conflict)0x0) {
              pnVar19 = (pnVar19->op_link).next;
            }
            eval(pcVar13,pnVar19);
            return;
          case N_EQ:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_NE:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_LT:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_LE:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_GT:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_GE:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_BITWISE_NOT:
            eval(pcVar13,(node_t_conflict)tree->env[0].__jmpbuf[2]);
            return;
          case N_NOT:
            eval(pcVar13,(node_t_conflict)tree->env[0].__jmpbuf[2]);
            return;
          case N_AND:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_OR:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_XOR:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_LSH:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_RSH:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_ADD:
            pnVar19 = (node_t_conflict)tree->env[0].__jmpbuf[2];
            if ((pnVar19 != (node_t_conflict)0x0) && ((pnVar19->op_link).next != (node_t)0x0)) {
              eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
              return;
            }
            eval(pcVar13,pnVar19);
            return;
          case N_SUB:
            pnVar19 = (node_t_conflict)tree->env[0].__jmpbuf[2];
            if ((pnVar19 != (node_t_conflict)0x0) && ((pnVar19->op_link).next != (node_t)0x0)) {
              eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
              return;
            }
            eval(pcVar13,pnVar19);
            return;
          case N_MUL:
            eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            return;
          case N_DIV:
          case N_MOD:
            iVar6 = eval_binop_operands(pcVar13,(node_t_conflict)tree,&vStack_140,&vStack_130);
            bVar24 = vStack_130.u.i_val == 0;
            if (iVar6 == 0) {
              if (vStack_130.u.i_val != 0) {
                bVar24 = false;
              }
            }
            else if (vStack_130.u.i_val != 0) {
              bVar24 = false;
            }
            if (!bVar24) {
              return;
            }
            pVar26 = get_node_pos(pcVar13,(node_t_conflict)tree);
            pcVar11 = "%";
            if (*(node_code_t *)&tree->ctx == N_DIV) {
              pcVar11 = "/";
            }
            error(pcVar13,0x1c3253,pVar26.fname,pVar26._8_8_,pcVar11);
            return;
          case N_COND:
            goto switchD_00195423_caseD_37;
          }
        }
        unaff_R12 = *(short **)((long)pnVar16 + (long)pcVar20 * 8 + -8);
        if (*unaff_R12 == 0x103) {
          c2m_ctx_00 = *(c2m_ctx_t *)(unaff_R12 + 0x14);
          pcStack_100 = (c2m_ctx_t)0x1951db;
          iVar7 = strcmp((char *)c2m_ctx_00,"defined");
          tree = pcStack_f0;
          if (iVar7 == 0) {
            pcVar17 = pcVar20;
            if ((pcVar20 < pcVar21) && (**(short **)(&pnVar16->code + (long)pcVar20 * 2) == 0x20)) {
              pcVar17 = (c2m_ctx_t)((long)&pcVar20->ctx + 1);
            }
            if (pcVar17 < pcVar21) {
              sVar3 = *(short *)*(token_t *)(&pnVar16->code + (long)pcVar17 * 2);
              if (sVar3 == 0x28) {
                pcVar13 = (c2m_ctx_t)((long)&pcVar17->ctx + 1);
                if ((pcVar13 < pcVar21) && (*(&pnVar16->attr)[(long)pcVar17] == 0x20)) {
                  pcVar13 = (c2m_ctx_t)((long)&pcVar17->ctx + 2);
                }
                if ((pcVar13 < pcVar21) &&
                   (*(short *)*(token_t *)(&pnVar16->code + (long)pcVar13 * 2) == 0x103)) {
                  c2m_ctx_00 = (c2m_ctx_t)((long)&pcVar13->ctx + 1);
                  if ((c2m_ctx_00 < pcVar21) && (*(&pnVar16->attr)[(long)pcVar13] == 0x20)) {
                    c2m_ctx_00 = (c2m_ctx_t)((long)&pcVar13->ctx + 2);
                  }
                  if ((c2m_ctx_00 < pcVar21) &&
                     (**(short **)(&pnVar16->code + (long)c2m_ctx_00 * 2) == 0x29)) {
                    pcStack_100 = (c2m_ctx_t)0x19535a;
                    mStack_c0.id = *(token_t *)(&pnVar16->code + (long)pcVar13 * 2);
                    iVar7 = HTAB_macro_t_do(ppStack_e0->macro_tab,&mStack_c0,HTAB_FIND,&pmStack_c8);
                    pcVar11 = "0";
                    if (iVar7 != 0) {
                      pcVar11 = "1";
                    }
                    uStack_d8 = *(undefined8 *)(unaff_R12 + 4);
                    uStack_d0 = *(undefined8 *)(unaff_R12 + 8);
                    tree = (c2m_ctx_t)0x30;
                    pcStack_100 = (c2m_ctx_t)0x195388;
                    puVar12 = (undefined4 *)reg_malloc(pcStack_e8,0x30);
                    *puVar12 = 0x100;
                    *(undefined8 *)(puVar12 + 2) = uStack_d8;
                    *(undefined8 *)(puVar12 + 4) = uStack_d0;
                    *(char **)(puVar12 + 10) = pcVar11;
                    puVar12[6] = 0;
                    *(undefined8 *)(puVar12 + 8) = 0;
                    pnVar16 = (node_t)pcStack_f0->env[0].__jmpbuf[0];
                    pcVar13 = pcStack_f0;
                    if ((pnVar16 == (node_t)0x0) ||
                       (pcVar17 = c2m_ctx_00, (c2m_ctx_t)pcStack_f0->ctx <= pcVar1))
                    goto LAB_001953f1;
                    goto LAB_001952b7;
                  }
                }
              }
              else if (sVar3 == 0x103) {
                pcStack_100 = (c2m_ctx_t)0x19524a;
                mStack_c0.id = *(token_t *)(&pnVar16->code + (long)pcVar17 * 2);
                iVar7 = HTAB_macro_t_do(ppStack_e0->macro_tab,&mStack_c0,HTAB_FIND,&pmStack_c8);
                pcVar11 = "0";
                if (iVar7 != 0) {
                  pcVar11 = "1";
                }
                uStack_d8 = *(undefined8 *)(unaff_R12 + 4);
                uStack_d0 = *(undefined8 *)(unaff_R12 + 8);
                tree = (c2m_ctx_t)0x30;
                pcStack_100 = (c2m_ctx_t)0x195278;
                puVar12 = (undefined4 *)reg_malloc(pcStack_e8,0x30);
                *puVar12 = 0x100;
                *(undefined8 *)(puVar12 + 2) = uStack_d8;
                *(undefined8 *)(puVar12 + 4) = uStack_d0;
                *(char **)(puVar12 + 10) = pcVar11;
                puVar12[6] = 0;
                *(undefined8 *)(puVar12 + 8) = 0;
                pnVar16 = (node_t)pcStack_f0->env[0].__jmpbuf[0];
                c2m_ctx_00 = pcStack_f0;
                pcVar21 = pcVar17;
                if ((pnVar16 == (node_t)0x0) || ((c2m_ctx_t)pcStack_f0->ctx <= pcVar1))
                goto LAB_001953ec;
LAB_001952b7:
                *(undefined4 **)((long)pnVar16 + (long)pcVar20 * 8 + -8) = puVar12;
                pcStack_100 = (c2m_ctx_t)0x1952c9;
                c2m_ctx_00 = pcStack_f0;
                del_tokens((VARR_token_t *)pcStack_f0,(int)pcVar20,(int)pcVar17 + iVar6);
                tree = pcStack_f0;
              }
            }
          }
        }
        pcVar20 = (c2m_ctx_t)((long)&pcVar20->ctx + 1);
        iVar6 = iVar6 + -1;
      } while (tree != (c2m_ctx_t)0x0);
    }
    pcStack_100 = (c2m_ctx_t)0x1953d8;
    replace_defined_cold_4();
    return;
  }
  uVar10 = *extraout_RDX;
  puVar5 = (undefined8 *)extraout_RDX[2];
  if (uVar10 == 0) {
    uVar22 = 0;
  }
  else {
    uVar22 = (ulong)(*(short *)*puVar5 == 0x20);
  }
  if ((uVar10 <= uVar22) || (*(short *)puVar5[uVar22] != 0x103)) {
LAB_00194f9c:
    warning(c2m_ctx_00,0x1c3532,(char *)tree->options,(node_t)tree->env[0].__jmpbuf[0]);
    return;
  }
  pVStack_78 = (VARR_char *)0x194f98;
  iVar6 = strcmp(*(char **)((short *)puVar5[uVar22] + 0x14),"STDC");
  if (iVar6 != 0) goto LAB_00194f9c;
  uVar23 = uVar22 + 1;
  if ((uVar23 < uVar10) && (*(short *)puVar5[uVar22 + 1] == 0x20)) {
    uVar23 = uVar22 | 2;
  }
  if ((uVar23 < uVar10) && (*(short *)puVar5[uVar23] == 0x103)) {
    pcVar11 = *(char **)((short *)puVar5[uVar23] + 0x14);
    pVStack_78 = (VARR_char *)0x195001;
    iVar6 = strcmp(pcVar11,"FP_CONTRACT");
    if (iVar6 != 0) {
      pVStack_78 = (VARR_char *)0x195014;
      iVar6 = strcmp(pcVar11,"FENV_ACCESS");
      if (iVar6 != 0) {
        pVStack_78 = (VARR_char *)0x195027;
        iVar6 = strcmp(pcVar11,"CX_LIMITED_RANGE");
        if (iVar6 != 0) {
          pcVar18 = tree->options;
          pnVar16 = (node_t)tree->env[0].__jmpbuf[0];
          pcVar15 = "unknown STDC pragma %s";
          goto LAB_00195040;
        }
      }
    }
    uVar22 = uVar23 + 1;
    if ((uVar22 < uVar10) && (*(short *)puVar5[uVar23 + 1] == 0x20)) {
      uVar22 = uVar23 + 2;
    }
    if ((uVar22 < uVar10) && (*(short *)puVar5[uVar22] == 0x103)) {
      pcVar11 = *(char **)((short *)puVar5[uVar22] + 0x14);
      pVStack_78 = (VARR_char *)0x1950ba;
      iVar6 = strcmp(pcVar11,"ON");
      if (iVar6 != 0) {
        pVStack_78 = (VARR_char *)0x1950cd;
        iVar6 = strcmp(pcVar11,"OFF");
        if (iVar6 != 0) {
          pVStack_78 = (VARR_char *)0x1950e0;
          iVar6 = strcmp(pcVar11,"DEFAULT");
          if (iVar6 != 0) {
            pcVar18 = tree->options;
            pnVar16 = (node_t)tree->env[0].__jmpbuf[0];
            pcVar15 = "unknown STDC pragma value";
LAB_00195040:
            error(c2m_ctx_00,pcVar15,(char *)pcVar18,pnVar16,pcVar11);
            return;
          }
        }
      }
      uVar23 = uVar22 + 1;
      if ((uVar23 < uVar10) &&
         ((*(short *)puVar5[uVar22 + 1] == 0x20 || (*(short *)puVar5[uVar22 + 1] == 10)))) {
        uVar23 = uVar22 + 2;
      }
      if (uVar10 <= uVar23) {
        return;
      }
      pcVar18 = tree->options;
      pnVar16 = (node_t)tree->env[0].__jmpbuf[0];
      pcVar11 = "garbage at STDC pragma end";
    }
    else {
      pcVar18 = tree->options;
      pnVar16 = (node_t)tree->env[0].__jmpbuf[0];
      pcVar11 = "wrong STDC pragma value";
    }
  }
  else {
    pcVar18 = tree->options;
    pnVar16 = (node_t)tree->env[0].__jmpbuf[0];
    pcVar11 = "wrong STDC pragma";
  }
  error(c2m_ctx_00,pcVar11,(char *)pcVar18,pnVar16);
  return;
switchD_00195423_caseD_37:
  vVar25 = eval(pcVar13,(node_t_conflict)tree->env[0].__jmpbuf[2]);
  vStack_140.u = vVar25.u;
  vStack_140.uns_p = vVar25.uns_p;
  pnVar19 = (node_t_conflict)tree->env[0].__jmpbuf[2];
  if (pnVar19 != (node_t_conflict)0x0) {
    uVar8 = (uint)(vStack_140.u.i_val == 0);
    do {
      pnVar19 = (pnVar19->op_link).next;
      bVar24 = uVar8 != 0;
      uVar8 = uVar8 - 1;
      if (pnVar19 == (node_t)0x0) break;
    } while (bVar24);
  }
  eval(pcVar13,pnVar19);
  return;
}

Assistant:

static void add_to_temp_string (c2m_ctx_t c2m_ctx, const char *str) {
  size_t i, len;

  if ((len = VARR_LENGTH (char, temp_string)) != 0
      && VARR_GET (char, temp_string, len - 1) == '\0') {
    VARR_POP (char, temp_string);
  }
  len = strlen (str);
  for (i = 0; i < len; i++) VARR_PUSH (char, temp_string, str[i]);
  VARR_PUSH (char, temp_string, '\0');
}